

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion.cc
# Opt level: O1

double __thiscall
FIX::double_conversion::StringToDoubleConverter::StringToIeee<unsigned_short_const*>
          (StringToDoubleConverter *this,unsigned_short *input,int length,bool read_as_double,
          int *processed_characters_count)

{
  unsigned_short uVar1;
  ushort uVar2;
  char *pcVar3;
  double dVar4;
  int *piVar5;
  long lVar6;
  unsigned_short *puVar7;
  unsigned_short *puVar8;
  int iVar9;
  bool bVar10;
  bool bVar11;
  unsigned_short uVar12;
  uint uVar13;
  int iVar14;
  undefined7 in_register_00000009;
  long lVar15;
  undefined7 uVar17;
  unsigned_short *puVar16;
  int iVar18;
  int iVar19;
  ulong uVar20;
  byte bVar21;
  uint uVar22;
  unsigned_short *puVar23;
  ulong uVar24;
  unsigned_short *puVar25;
  uint uVar26;
  undefined4 in_XMM0_Da;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  float fVar27;
  undefined4 in_XMM0_Db;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  Vector<const_char> buffer_00;
  Vector<const_char> buffer_01;
  bool result_is_junk_1;
  char *start;
  char buffer [782];
  unsigned_short *local_3a8;
  uint local_39c;
  unsigned_short *local_398;
  int *local_390;
  uint local_388;
  int local_384;
  uint local_380;
  bool local_379;
  StringToDoubleConverter *local_378;
  ulong local_370;
  undefined1 local_368 [16];
  double_conversion *local_350;
  double_conversion local_348 [792];
  
  *processed_characters_count = 0;
  if (length == 0) {
LAB_0016c256:
    return this->empty_string_value_;
  }
  local_368._0_4_ = (int)CONCAT71(in_register_00000009,read_as_double);
  uVar22 = this->flags_;
  local_3a8 = input;
  if ((uVar22 & 0x18) != 0) {
    bVar10 = isWhitespace((uint)*input);
    in_XMM0_Da = extraout_XMM0_Da;
    in_XMM0_Db = extraout_XMM0_Db;
    if (bVar10) {
      lVar15 = (long)length * 2;
      puVar7 = input + 1;
      local_380 = uVar22;
      do {
        puVar16 = puVar7;
        lVar15 = lVar15 + -2;
        if (lVar15 == 0) goto LAB_0016c249;
        bVar10 = isWhitespace((uint)*puVar16);
        puVar7 = puVar16 + 1;
      } while (bVar10);
      in_XMM0_Da = extraout_XMM0_Da_00;
      in_XMM0_Db = extraout_XMM0_Db_00;
      uVar22 = local_380;
      local_3a8 = puVar16;
      if (lVar15 == 0) {
LAB_0016c249:
        *processed_characters_count = (int)((ulong)((long)puVar16 - (long)input) >> 1);
        goto LAB_0016c256;
      }
    }
    if (((uVar22 & 8) == 0) && (local_3a8 != input)) goto LAB_0016ca0b;
  }
  puVar16 = local_3a8;
  puVar7 = input + length;
  uVar1 = *local_3a8;
  local_398 = input;
  local_390 = processed_characters_count;
  if ((uVar1 == 0x2d) || (uVar1 == 0x2b)) {
    local_39c = (uint)CONCAT11((char)(uVar1 >> 8),uVar1 == 0x2d);
    puVar23 = local_3a8 + 1;
    lVar15 = 2;
    bVar10 = puVar23 != puVar7;
    if ((bVar10) &&
       (puVar25 = local_3a8 + 1, local_3a8 = puVar23, bVar11 = isWhitespace((uint)*puVar25),
       in_XMM0_Da = extraout_XMM0_Da_01, in_XMM0_Db = extraout_XMM0_Db_01, puVar23 = local_3a8,
       bVar11)) {
      lVar6 = 4;
      do {
        lVar15 = lVar6;
        bVar11 = (unsigned_short *)((long)puVar16 + lVar15) == puVar7;
        bVar10 = !bVar11;
        puVar23 = local_3a8;
        if (bVar11) break;
        bVar11 = isWhitespace((uint)*(ushort *)((long)puVar16 + lVar15));
        lVar6 = lVar15 + 2;
        in_XMM0_Da = extraout_XMM0_Da_02;
        in_XMM0_Db = extraout_XMM0_Db_02;
        puVar23 = local_3a8;
      } while (bVar11);
    }
    local_3a8 = puVar23;
    if (bVar10) {
      if (lVar15 == 2 || (char)((uVar22 & 0x20) >> 5) != '\0') {
        local_3a8 = (unsigned_short *)((long)puVar16 + lVar15);
        bVar10 = true;
      }
      else {
        in_XMM0_Da = SUB84(this->junk_string_value_,0);
        in_XMM0_Db = (undefined4)((ulong)this->junk_string_value_ >> 0x20);
        bVar10 = false;
      }
    }
    else {
      in_XMM0_Da = SUB84(this->junk_string_value_,0);
      in_XMM0_Db = (undefined4)((ulong)this->junk_string_value_ >> 0x20);
      bVar10 = false;
    }
    if (!bVar10) {
      return (double)CONCAT44(in_XMM0_Db,in_XMM0_Da);
    }
  }
  else {
    local_39c = 0;
  }
  piVar5 = local_390;
  pcVar3 = this->infinity_symbol_;
  bVar21 = (byte)uVar22;
  if ((pcVar3 != (char *)0x0) && ((uint)*local_3a8 == (int)*pcVar3)) {
    bVar10 = ConsumeSubString<unsigned_short_const*>(&local_3a8,puVar7,pcVar3);
    puVar16 = local_3a8;
    if ((bVar10) && (local_3a8 == puVar7 || (uVar22 & 0x14) != 0)) {
      if ((uVar22 & 4) == 0) {
        bVar10 = local_3a8 != puVar7;
        if ((bVar10) && (bVar11 = isWhitespace((uint)*local_3a8), bVar11)) {
          do {
            puVar16 = puVar16 + 1;
            bVar10 = puVar16 != puVar7;
            if (puVar16 == puVar7) break;
            bVar11 = isWhitespace((uint)*puVar16);
          } while (bVar11);
        }
        local_3a8 = puVar16;
        if (bVar10) goto LAB_0016ca0b;
      }
      *local_390 = (int)((ulong)((long)local_3a8 - (long)local_398) >> 1);
      if ((char)local_39c == '\0') {
        return INFINITY;
      }
      return -INFINITY;
    }
    goto LAB_0016ca0b;
  }
  pcVar3 = this->nan_symbol_;
  if ((pcVar3 != (char *)0x0) && ((uint)*local_3a8 == (int)*pcVar3)) {
    bVar10 = ConsumeSubString<unsigned_short_const*>(&local_3a8,puVar7,pcVar3);
    puVar16 = local_3a8;
    if ((bVar10) && (local_3a8 == puVar7 || (uVar22 & 0x14) != 0)) {
      if ((uVar22 & 4) == 0) {
        bVar10 = local_3a8 != puVar7;
        if ((bVar10) && (bVar11 = isWhitespace((uint)*local_3a8), bVar11)) {
          do {
            puVar16 = puVar16 + 1;
            bVar10 = puVar16 != puVar7;
            if (puVar16 == puVar7) break;
            bVar11 = isWhitespace((uint)*puVar16);
          } while (bVar11);
        }
        local_3a8 = puVar16;
        if (bVar10) goto LAB_0016ca0b;
      }
      *local_390 = (int)((ulong)((long)local_3a8 - (long)local_398) >> 1);
      if ((char)local_39c == '\0') {
        return NAN;
      }
      return -NAN;
    }
    goto LAB_0016ca0b;
  }
  uVar1 = *local_3a8;
  puVar16 = (unsigned_short *)0x0;
  puVar23 = (unsigned_short *)0x0;
  if (uVar1 == 0x30) {
    puVar25 = local_3a8 + 1;
    if (puVar25 == puVar7) {
      uVar24 = (long)puVar25 - (long)local_398;
LAB_0016c781:
      *local_390 = (int)(uVar24 >> 1);
    }
    else {
      if (((uVar22 & 1) != 0) && ((*puVar25 | 0x20) == 0x78)) {
        local_3a8 = local_3a8 + 2;
        if ((local_3a8 != puVar7) &&
           ((uVar2 = *local_3a8, uVar2 < 0x40 && uVar2 - 0x30 < 10 ||
            ((uVar13 = uVar2 - 0x41, uVar13 < 0x26 &&
             ((0x3f0000003fU >> ((ulong)uVar13 & 0x3f) & 1) != 0)))))) {
          local_368._0_8_ =
               RadixStringToIeee<4,unsigned_short_const*>
                         (&local_3a8,puVar7,(bool)(char)local_39c,SUB41((uVar22 & 4) >> 2,0),
                          this->junk_string_value_,local_368[0],(bool *)local_348);
          puVar16 = local_3a8;
          if (local_348[0] != (double_conversion)0x0) {
            return (double)local_368._0_8_;
          }
          if (local_3a8 != puVar7 && (uVar22 & 0x10) != 0) {
            local_368._8_4_ = extraout_XMM0_Dc;
            local_368._12_4_ = extraout_XMM0_Dd;
            bVar10 = isWhitespace((uint)*local_3a8);
            if (bVar10) {
              do {
                puVar16 = puVar16 + 1;
                if (puVar16 == puVar7) break;
                bVar10 = isWhitespace((uint)*puVar16);
              } while (bVar10);
            }
          }
          local_3a8 = puVar16;
          *piVar5 = (int)((ulong)((long)local_3a8 - (long)local_398) >> 1);
          return (double)local_368._0_8_;
        }
        goto LAB_0016ca0b;
      }
      uVar24 = (long)puVar25 - (long)local_398;
      do {
        if (*puVar25 != 0x30) {
          puVar23 = (unsigned_short *)(ulong)(bVar21 >> 1);
          local_3a8 = puVar25;
          goto LAB_0016c413;
        }
        puVar25 = puVar25 + 1;
        uVar24 = uVar24 + 2;
      } while (puVar25 != puVar7);
      *local_390 = (int)(uVar24 >> 1);
    }
    if ((bool)(char)local_39c == false) {
      return 0.0;
    }
    return -0.0;
  }
LAB_0016c413:
  iVar18 = 0;
  uVar13 = 0;
  uVar26 = 0;
  do {
    uVar12 = *local_3a8;
    iVar14 = (int)puVar16;
    if (9 < (ushort)(uVar12 - 0x30)) {
      if (iVar14 == 0) {
        puVar23 = puVar16;
      }
      uVar20 = 0;
      if (uVar12 != 0x2e) goto LAB_0016c82c;
      if (((~(byte)puVar23 | bVar21 >> 2) & 1) == 0) goto LAB_0016ca0b;
      uVar20 = 0;
      puVar25 = local_3a8;
      if (((ulong)puVar23 & 1) != 0) goto LAB_0016c493;
      puVar25 = local_3a8 + 1;
      if (puVar25 == puVar7) {
        if ((iVar14 != 0) || (uVar1 == 0x30)) goto LAB_0016c493;
        goto LAB_0016ca0b;
      }
      uVar20 = 0;
      if ((iVar14 != 0) || (uVar20 = 0, *puVar25 != 0x30)) goto LAB_0016c6a2;
      uVar24 = (long)(local_3a8 + 2) - (long)local_398;
      uVar20 = 0;
      puVar8 = local_3a8 + 2;
      goto LAB_0016c676;
    }
    if (iVar14 < 0x304) {
      if (0x30d < (int)uVar26) {
        __assert_fail("buffer_pos < kBufferSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/double-conversion.cc"
                      ,0x319,
                      "double FIX::double_conversion::StringToDoubleConverter::StringToIeee(Iterator, int, bool, int *) const [Iterator = const unsigned short *]"
                     );
      }
      lVar15 = (long)(int)uVar26;
      uVar26 = uVar26 + 1;
      local_348[lVar15] = SUB21(uVar12,0);
      puVar16 = (unsigned_short *)(ulong)(iVar14 + 1);
    }
    else {
      iVar18 = iVar18 + 1;
      uVar13 = (uint)CONCAT11((char)(uVar12 >> 8),uVar12 != 0x30 | (byte)uVar13);
    }
    if (((ulong)puVar23 & 1) == 0) {
      puVar23 = (unsigned_short *)0x0;
    }
    else {
      puVar23 = (unsigned_short *)(ulong)(*local_3a8 < 0x38);
    }
    local_3a8 = local_3a8 + 1;
  } while (local_3a8 != puVar7);
  uVar20 = 0;
  puVar25 = local_3a8;
  goto LAB_0016c493;
LAB_0016c82c:
  iVar19 = (int)uVar20;
  if ((iVar14 == 0 && iVar19 == 0) && uVar1 != 0x30) goto LAB_0016ca0b;
  puVar16 = local_3a8;
  if ((*local_3a8 | 0x20) == 0x65) {
    if (((~(byte)puVar23 | bVar21 >> 2) & 1) == 0) goto LAB_0016ca0b;
    puVar25 = local_3a8;
    if (((ulong)puVar23 & 1) == 0) {
      puVar25 = local_3a8 + 1;
      if (puVar25 == puVar7) {
        if ((uVar22 & 4) == 0) goto LAB_0016ca0b;
      }
      else {
        uVar1 = *puVar25;
        if ((((uVar1 == 0x2d) || (uVar12 = 0x2b, uVar1 == 0x2b)) &&
            (local_3a8 = local_3a8 + 2, puVar16 = local_3a8, puVar25 = local_3a8, uVar12 = uVar1,
            local_3a8 == puVar7)) ||
           ((local_3a8 = puVar25, puVar16 = local_3a8, local_3a8 == puVar7 ||
            (puVar16 = (unsigned_short *)(ulong)(*local_3a8 - 0x3a),
            (ushort)(*local_3a8 - 0x3a) < 0xfff6)))) {
          iVar14 = 6;
          if ((uVar22 & 4) == 0) {
            in_XMM0_Da = SUB84(this->junk_string_value_,0);
            in_XMM0_Db = (undefined4)((ulong)this->junk_string_value_ >> 0x20);
            iVar14 = 1;
          }
        }
        else {
          if (0x3ffffffe < iVar19 + 0x1fffffffU) {
            __assert_fail("-max_exponent / 2 <= exponent && exponent <= max_exponent / 2",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/double-conversion.cc"
                          ,0x380,
                          "double FIX::double_conversion::StringToDoubleConverter::StringToIeee(Iterator, int, bool, int *) const [Iterator = const unsigned short *]"
                         );
          }
          iVar14 = 0;
          do {
            puVar16 = local_3a8 + 1;
            if ((iVar14 < 0x6666666) ||
               ((iVar9 = 0x3fffffff, iVar14 == 0x6666666 && (*local_3a8 < 0x34)))) {
              iVar9 = (uint)*local_3a8 + iVar14 * 10 + -0x30;
            }
            iVar14 = iVar9;
            local_3a8 = puVar16;
          } while ((puVar16 != puVar7) && ((ushort)(*puVar16 - 0x30) < 10));
          iVar9 = -iVar14;
          if ((char)uVar12 != '-') {
            iVar9 = iVar14;
          }
          iVar14 = 0;
          uVar20 = (ulong)(uint)(iVar9 + iVar19);
        }
        puVar25 = local_3a8;
        if (iVar14 != 6) {
          if (iVar14 != 0) {
            return (double)CONCAT44(in_XMM0_Db,in_XMM0_Da);
          }
          goto LAB_0016c979;
        }
      }
    }
  }
  else {
LAB_0016c979:
    puVar25 = local_3a8;
    uVar17 = (undefined7)((ulong)puVar16 >> 8);
    if (local_3a8 != puVar7 && (uVar22 & 0x14) == 0) {
LAB_0016ca0b:
      return this->junk_string_value_;
    }
    if ((uVar22 & 4) == 0) {
      bVar10 = local_3a8 != puVar7;
      if ((bVar10) &&
         (local_388 = uVar13, local_384 = iVar18, local_380 = uVar22, local_378 = this,
         local_370 = uVar20, bVar11 = isWhitespace((uint)*local_3a8), uVar20 = local_370,
         this = local_378, uVar22 = local_380, iVar18 = local_384, uVar13 = local_388, bVar11)) {
        do {
          puVar25 = puVar25 + 1;
          bVar10 = puVar25 != puVar7;
          uVar20 = local_370;
          this = local_378;
          uVar22 = local_380;
          iVar18 = local_384;
          uVar13 = local_388;
          if (puVar25 == puVar7) break;
          bVar11 = isWhitespace((uint)*puVar25);
          uVar20 = local_370;
          this = local_378;
          uVar22 = local_380;
          iVar18 = local_384;
          uVar13 = local_388;
        } while (bVar11);
      }
      local_3a8 = puVar25;
      if (bVar10) goto LAB_0016ca0b;
    }
    puVar25 = local_3a8;
    bVar10 = (uVar22 & 0x10) == 0;
    puVar16 = (unsigned_short *)CONCAT71(uVar17,local_3a8 == puVar7 || bVar10);
    if ((local_3a8 != puVar7 && !bVar10) &&
       (local_388 = uVar13, local_384 = iVar18, local_378 = this, local_370 = uVar20,
       bVar10 = isWhitespace((uint)*local_3a8), uVar20 = local_370, this = local_378,
       iVar18 = local_384, uVar13 = local_388, bVar10)) {
      do {
        puVar25 = puVar25 + 1;
        uVar20 = local_370;
        this = local_378;
        iVar18 = local_384;
        uVar13 = local_388;
        if (puVar25 == puVar7) break;
        bVar10 = isWhitespace((uint)*puVar25);
        uVar20 = local_370;
        this = local_378;
        iVar18 = local_384;
        uVar13 = local_388;
      } while (bVar10);
    }
  }
  goto LAB_0016c493;
LAB_0016c676:
  do {
    puVar25 = puVar8;
    if (puVar25 == puVar7) goto LAB_0016c781;
    uVar20 = (ulong)((int)uVar20 - 1);
    uVar24 = uVar24 + 2;
    puVar8 = puVar25 + 1;
  } while (*puVar25 == 0x30);
LAB_0016c6a2:
  do {
    iVar14 = (int)puVar16;
    uVar12 = *puVar25;
    local_3a8 = puVar25;
    if (9 < (ushort)(uVar12 - 0x30)) goto LAB_0016c82c;
    if (iVar14 < 0x304) {
      if (0x30d < (int)uVar26) {
        __assert_fail("buffer_pos < kBufferSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/double-conversion.cc"
                      ,0x349,
                      "double FIX::double_conversion::StringToDoubleConverter::StringToIeee(Iterator, int, bool, int *) const [Iterator = const unsigned short *]"
                     );
      }
      lVar15 = (long)(int)uVar26;
      uVar26 = uVar26 + 1;
      local_348[lVar15] = SUB21(uVar12,0);
      puVar16 = (unsigned_short *)(ulong)(iVar14 + 1);
      uVar20 = (ulong)((int)uVar20 - 1);
    }
    else {
      uVar13 = (uint)CONCAT11((char)(uVar12 >> 8),uVar12 != 0x30 | (byte)uVar13);
    }
    puVar25 = puVar25 + 1;
  } while (puVar25 != puVar7);
LAB_0016c493:
  local_3a8 = puVar25;
  piVar5 = local_390;
  puVar7 = local_398;
  if (((ulong)puVar23 & 1) != 0) {
    local_350 = local_348;
    dVar4 = RadixStringToIeee<3,char*>
                      ((char **)&local_350,(char *)(local_348 + (int)uVar26),(bool)(char)local_39c,
                       SUB41((uVar22 & 4) >> 2,0),this->junk_string_value_,local_368[0],&local_379);
    if (local_379 != true) {
      *local_390 = (int)((ulong)((long)local_3a8 - (long)puVar7) >> 1);
      return dVar4;
    }
    __assert_fail("!result_is_junk",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/double-conversion.cc"
                  ,0x3a9,
                  "double FIX::double_conversion::StringToDoubleConverter::StringToIeee(Iterator, int, bool, int *) const [Iterator = const unsigned short *]"
                 );
  }
  iVar18 = (int)uVar20 + iVar18;
  if ((uVar13 & 1) != 0) {
    lVar15 = (long)(int)uVar26;
    uVar26 = uVar26 + 1;
    local_348[lVar15] = (double_conversion)0x31;
    iVar18 = iVar18 + -1;
  }
  if (0x30d < (int)uVar26) {
    __assert_fail("buffer_pos < kBufferSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/double-conversion.cc"
                  ,0x3b3,
                  "double FIX::double_conversion::StringToDoubleConverter::StringToIeee(Iterator, int, bool, int *) const [Iterator = const unsigned short *]"
                 );
  }
  local_348[(int)uVar26] = (double_conversion)0x0;
  if (local_368[0] == false) {
    if ((int)uVar26 < 0) goto LAB_0016cb05;
    buffer_01.start_ = (ulong)uVar26;
    buffer_01.length_ = iVar18;
    buffer_01._12_4_ = 0;
    fVar27 = Strtof(local_348,buffer_01,(int)puVar16);
    dVar4 = (double)fVar27;
  }
  else {
    if ((int)uVar26 < 0) {
LAB_0016cb05:
      __assert_fail("len == 0 || (len > 0 && data != __null)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/utils.h"
                    ,0xb3,
                    "FIX::double_conversion::Vector<const char>::Vector(T *, int) [T = const char]")
      ;
    }
    buffer_00.start_ = (ulong)uVar26;
    buffer_00.length_ = iVar18;
    buffer_00._12_4_ = 0;
    dVar4 = Strtod(local_348,buffer_00,(int)puVar16);
  }
  *piVar5 = (int)((ulong)((long)local_3a8 - (long)puVar7) >> 1);
  if ((char)local_39c == '\0') {
    return dVar4;
  }
  return -dVar4;
}

Assistant:

double StringToDoubleConverter::StringToIeee(
    Iterator input,
    int length,
    bool read_as_double,
    int* processed_characters_count) const {
  Iterator current = input;
  Iterator end = input + length;

  *processed_characters_count = 0;

  const bool allow_trailing_junk = (flags_ & ALLOW_TRAILING_JUNK) != 0;
  const bool allow_leading_spaces = (flags_ & ALLOW_LEADING_SPACES) != 0;
  const bool allow_trailing_spaces = (flags_ & ALLOW_TRAILING_SPACES) != 0;
  const bool allow_spaces_after_sign = (flags_ & ALLOW_SPACES_AFTER_SIGN) != 0;

  // To make sure that iterator dereferencing is valid the following
  // convention is used:
  // 1. Each '++current' statement is followed by check for equality to 'end'.
  // 2. If AdvanceToNonspace returned false then current == end.
  // 3. If 'current' becomes equal to 'end' the function returns or goes to
  // 'parsing_done'.
  // 4. 'current' is not dereferenced after the 'parsing_done' label.
  // 5. Code before 'parsing_done' may rely on 'current != end'.
  if (current == end) return empty_string_value_;

  if (allow_leading_spaces || allow_trailing_spaces) {
    if (!AdvanceToNonspace(&current, end)) {
      *processed_characters_count = static_cast<int>(current - input);
      return empty_string_value_;
    }
    if (!allow_leading_spaces && (input != current)) {
      // No leading spaces allowed, but AdvanceToNonspace moved forward.
      return junk_string_value_;
    }
  }

  // The longest form of simplified number is: "-<significant digits>.1eXXX\0".
  const int kBufferSize = kMaxSignificantDigits + 10;
  char buffer[kBufferSize];  // NOLINT: size is known at compile time.
  int buffer_pos = 0;

  // Exponent will be adjusted if insignificant digits of the integer part
  // or insignificant leading zeros of the fractional part are dropped.
  int exponent = 0;
  int significant_digits = 0;
  int insignificant_digits = 0;
  bool nonzero_digit_dropped = false;

  bool sign = false;

  if (*current == '+' || *current == '-') {
    sign = (*current == '-');
    ++current;
    Iterator next_non_space = current;
    // Skip following spaces (if allowed).
    if (!AdvanceToNonspace(&next_non_space, end)) return junk_string_value_;
    if (!allow_spaces_after_sign && (current != next_non_space)) {
      return junk_string_value_;
    }
    current = next_non_space;
  }

  if (infinity_symbol_ != NULL) {
    if (*current == infinity_symbol_[0]) {
      if (!ConsumeSubString(&current, end, infinity_symbol_)) {
        return junk_string_value_;
      }

      if (!(allow_trailing_spaces || allow_trailing_junk) && (current != end)) {
        return junk_string_value_;
      }
      if (!allow_trailing_junk && AdvanceToNonspace(&current, end)) {
        return junk_string_value_;
      }

      ASSERT(buffer_pos == 0);
      *processed_characters_count = static_cast<int>(current - input);
      return sign ? -Double::Infinity() : Double::Infinity();
    }
  }

  if (nan_symbol_ != NULL) {
    if (*current == nan_symbol_[0]) {
      if (!ConsumeSubString(&current, end, nan_symbol_)) {
        return junk_string_value_;
      }

      if (!(allow_trailing_spaces || allow_trailing_junk) && (current != end)) {
        return junk_string_value_;
      }
      if (!allow_trailing_junk && AdvanceToNonspace(&current, end)) {
        return junk_string_value_;
      }

      ASSERT(buffer_pos == 0);
      *processed_characters_count = static_cast<int>(current - input);
      return sign ? -Double::NaN() : Double::NaN();
    }
  }

  bool leading_zero = false;
  if (*current == '0') {
    ++current;
    if (current == end) {
      *processed_characters_count = static_cast<int>(current - input);
      return SignedZero(sign);
    }

    leading_zero = true;

    // It could be hexadecimal value.
    if ((flags_ & ALLOW_HEX) && (*current == 'x' || *current == 'X')) {
      ++current;
      if (current == end || !isDigit(*current, 16)) {
        return junk_string_value_;  // "0x".
      }

      bool result_is_junk;
      double result = RadixStringToIeee<4>(&current,
                                           end,
                                           sign,
                                           allow_trailing_junk,
                                           junk_string_value_,
                                           read_as_double,
                                           &result_is_junk);
      if (!result_is_junk) {
        if (allow_trailing_spaces) AdvanceToNonspace(&current, end);
        *processed_characters_count = static_cast<int>(current - input);
      }
      return result;
    }

    // Ignore leading zeros in the integer part.
    while (*current == '0') {
      ++current;
      if (current == end) {
        *processed_characters_count = static_cast<int>(current - input);
        return SignedZero(sign);
      }
    }
  }

  bool octal = leading_zero && (flags_ & ALLOW_OCTALS) != 0;

  // Copy significant digits of the integer part (if any) to the buffer.
  while (*current >= '0' && *current <= '9') {
    if (significant_digits < kMaxSignificantDigits) {
      ASSERT(buffer_pos < kBufferSize);
      buffer[buffer_pos++] = static_cast<char>(*current);
      significant_digits++;
      // Will later check if it's an octal in the buffer.
    } else {
      insignificant_digits++;  // Move the digit into the exponential part.
      nonzero_digit_dropped = nonzero_digit_dropped || *current != '0';
    }
    octal = octal && *current < '8';
    ++current;
    if (current == end) goto parsing_done;
  }

  if (significant_digits == 0) {
    octal = false;
  }

  if (*current == '.') {
    if (octal && !allow_trailing_junk) return junk_string_value_;
    if (octal) goto parsing_done;

    ++current;
    if (current == end) {
      if (significant_digits == 0 && !leading_zero) {
        return junk_string_value_;
      } else {
        goto parsing_done;
      }
    }

    if (significant_digits == 0) {
      // octal = false;
      // Integer part consists of 0 or is absent. Significant digits start after
      // leading zeros (if any).
      while (*current == '0') {
        ++current;
        if (current == end) {
          *processed_characters_count = static_cast<int>(current - input);
          return SignedZero(sign);
        }
        exponent--;  // Move this 0 into the exponent.
      }
    }

    // There is a fractional part.
    // We don't emit a '.', but adjust the exponent instead.
    while (*current >= '0' && *current <= '9') {
      if (significant_digits < kMaxSignificantDigits) {
        ASSERT(buffer_pos < kBufferSize);
        buffer[buffer_pos++] = static_cast<char>(*current);
        significant_digits++;
        exponent--;
      } else {
        // Ignore insignificant digits in the fractional part.
        nonzero_digit_dropped = nonzero_digit_dropped || *current != '0';
      }
      ++current;
      if (current == end) goto parsing_done;
    }
  }

  if (!leading_zero && exponent == 0 && significant_digits == 0) {
    // If leading_zeros is true then the string contains zeros.
    // If exponent < 0 then string was [+-]\.0*...
    // If significant_digits != 0 the string is not equal to 0.
    // Otherwise there are no digits in the string.
    return junk_string_value_;
  }

  // Parse exponential part.
  if (*current == 'e' || *current == 'E') {
    if (octal && !allow_trailing_junk) return junk_string_value_;
    if (octal) goto parsing_done;
    ++current;
    if (current == end) {
      if (allow_trailing_junk) {
        goto parsing_done;
      } else {
        return junk_string_value_;
      }
    }
    char exponen_sign = '+';
    if (*current == '+' || *current == '-') {
      exponen_sign = static_cast<char>(*current);
      ++current;
      if (current == end) {
        if (allow_trailing_junk) {
          goto parsing_done;
        } else {
          return junk_string_value_;
        }
      }
    }

    if (current == end || *current < '0' || *current > '9') {
      if (allow_trailing_junk) {
        goto parsing_done;
      } else {
        return junk_string_value_;
      }
    }

    const int max_exponent = INT_MAX / 2;
    ASSERT(-max_exponent / 2 <= exponent && exponent <= max_exponent / 2);
    int num = 0;
    do {
      // Check overflow.
      int digit = *current - '0';
      if (num >= max_exponent / 10
          && !(num == max_exponent / 10 && digit <= max_exponent % 10)) {
        num = max_exponent;
      } else {
        num = num * 10 + digit;
      }
      ++current;
    } while (current != end && *current >= '0' && *current <= '9');

    exponent += (exponen_sign == '-' ? -num : num);
  }

  if (!(allow_trailing_spaces || allow_trailing_junk) && (current != end)) {
    return junk_string_value_;
  }
  if (!allow_trailing_junk && AdvanceToNonspace(&current, end)) {
    return junk_string_value_;
  }
  if (allow_trailing_spaces) {
    AdvanceToNonspace(&current, end);
  }

  parsing_done:
  exponent += insignificant_digits;

  if (octal) {
    double result;
    bool result_is_junk;
    char* start = buffer;
    result = RadixStringToIeee<3>(&start,
                                  buffer + buffer_pos,
                                  sign,
                                  allow_trailing_junk,
                                  junk_string_value_,
                                  read_as_double,
                                  &result_is_junk);
    ASSERT(!result_is_junk);
    *processed_characters_count = static_cast<int>(current - input);
    return result;
  }

  if (nonzero_digit_dropped) {
    buffer[buffer_pos++] = '1';
    exponent--;
  }

  ASSERT(buffer_pos < kBufferSize);
  buffer[buffer_pos] = '\0';

  double converted;
  if (read_as_double) {
    converted = Strtod(Vector<const char>(buffer, buffer_pos), exponent);
  } else {
    converted = Strtof(Vector<const char>(buffer, buffer_pos), exponent);
  }
  *processed_characters_count = static_cast<int>(current - input);
  return sign? -converted: converted;
}